

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O0

bool __thiscall nuraft::raft_server::commit_in_bg_exec(raft_server *this,size_t timeout_ms)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  log_val_type lVar4;
  int iVar5;
  srv_role sVar6;
  __int_type_conflict _Var7;
  element_type *peVar8;
  undefined4 extraout_var;
  __int_type _Var9;
  element_type *this_00;
  __int_type _Var10;
  undefined4 extraout_var_00;
  uint64_t uVar11;
  element_type *peVar12;
  element_type *peVar13;
  ulong uVar14;
  ulong uVar15;
  element_type *peVar16;
  undefined8 *puVar17;
  element_type *peVar18;
  ulong *puVar19;
  long in_RSI;
  ulong in_RDI;
  Param local_res2b0;
  Param local_res2c8;
  ptr<raft_params> params;
  ulong local_idx;
  ulong leader_idx;
  uint64_t log_idx;
  Param param;
  ulong exp_idx;
  ptr<log_entry> le;
  ulong index_to_commit;
  timer_helper tt;
  bool finished_in_time;
  bool first_loop_exec;
  bool need_to_handle_commit_elem;
  ptr<cluster_config> cur_config;
  ulong log_start_idx;
  ExecCommitAutoCleaner exec_auto_cleaner;
  unique_lock<std::mutex> ll;
  memory_order __b_7;
  memory_order __b_6;
  memory_order __b_5;
  memory_order __b_4;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  undefined7 in_stack_fffffffffffff9c8;
  undefined1 in_stack_fffffffffffff9cf;
  memory_order in_stack_fffffffffffff9d0;
  memory_order in_stack_fffffffffffff9d4;
  cb_func *in_stack_fffffffffffff9d8;
  cb_func *pcVar20;
  timer_helper *in_stack_fffffffffffff9e0;
  undefined1 *puVar21;
  undefined4 in_stack_fffffffffffff9e8;
  int32_t iVar22;
  undefined4 in_stack_fffffffffffff9ec;
  uint uVar23;
  timer_helper *in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa1c;
  undefined7 in_stack_fffffffffffffae0;
  undefined1 in_stack_fffffffffffffae7;
  ulong in_stack_fffffffffffffae8;
  undefined7 in_stack_fffffffffffffaf0;
  undefined1 in_stack_fffffffffffffaf7;
  byte local_3ea;
  int in_stack_fffffffffffffc64;
  ptr<log_entry> *le_00;
  raft_server *in_stack_fffffffffffffc78;
  Param local_370;
  cb_func *local_348;
  undefined1 *local_340;
  string local_338 [32];
  string local_318 [32];
  ulong local_2f8;
  Param local_2f0;
  undefined1 local_2d8 [7];
  ulong in_stack_fffffffffffffd30;
  raft_server *in_stack_fffffffffffffd38;
  string local_2b0 [32];
  __shared_ptr local_290 [16];
  string local_280 [32];
  ulong local_260;
  string local_258 [101];
  byte local_1f3;
  byte local_1f2;
  byte local_1f1;
  string local_1e0 [32];
  long local_1c0;
  string local_1b8 [56];
  ptr<log_entry> local_180 [4];
  undefined4 local_140;
  unique_lock<std::mutex> local_138;
  long local_128;
  byte local_111;
  cb_func *local_110;
  memory_order local_108;
  int local_104;
  undefined8 *local_100;
  undefined1 *local_f8;
  memory_order local_f0;
  int local_ec;
  undefined8 *local_e8;
  undefined8 local_e0;
  memory_order local_d8;
  int local_d4;
  undefined8 *local_d0;
  undefined8 local_c8;
  memory_order local_c0;
  int local_bc;
  undefined8 *local_b8;
  undefined8 local_b0;
  memory_order local_a8;
  int local_a4;
  undefined8 *local_a0;
  undefined8 local_98;
  memory_order local_90;
  int local_8c;
  undefined8 *local_88;
  undefined8 local_80;
  memory_order local_78;
  int local_74;
  undefined8 *local_70;
  undefined8 local_68;
  memory_order local_60;
  int local_5c;
  undefined8 *local_58;
  undefined4 local_4c;
  ulong local_48;
  undefined1 *local_40;
  ulong *local_38;
  bool local_29;
  ulong local_28;
  memory_order local_20;
  undefined4 local_1c;
  ulong local_18;
  undefined1 *local_10;
  ulong *local_8;
  
  local_128 = in_RSI;
  std::unique_lock<std::mutex>::unique_lock(&local_138,in_RDI + 0x488);
  bVar3 = std::unique_lock<std::mutex>::owns_lock(&local_138);
  if (bVar3) {
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
               (bool)in_stack_fffffffffffff9cf);
    le_00 = local_180;
    std::function<void()>::function<nuraft::raft_server::commit_in_bg_exec(unsigned_long)::__0,void>
              ((function<void_()> *)in_stack_fffffffffffff9e0,
               (anon_class_8_1_8991fb9c *)in_stack_fffffffffffff9d8);
    commit_in_bg_exec(unsigned_long)::ExecCommitAutoCleaner::ExecCommitAutoCleaner(std::
    function<void()>_((ExecCommitAutoCleaner *)
                      CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                      (function<void_()> *)
                      CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8));
    std::function<void_()>::~function((function<void_()> *)0x1d41ce);
    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar3) {
      peVar16 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d41ff);
      in_stack_fffffffffffffc64 = (*peVar16->_vptr_logger[7])();
      if (4 < in_stack_fffffffffffffc64) {
        peVar16 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d4238);
        puVar17 = (undefined8 *)(in_RDI + 0xa0);
        local_5c = 5;
        local_58 = puVar17;
        local_60 = std::operator&(memory_order_seq_cst,__memory_order_mask);
        if (local_5c - 1U < 2) {
          local_68 = *puVar17;
        }
        else if (local_5c == 5) {
          local_68 = *puVar17;
        }
        else {
          local_68 = *puVar17;
        }
        uVar2 = local_68;
        puVar17 = (undefined8 *)(in_RDI + 0xa8);
        local_74 = 5;
        local_70 = puVar17;
        local_78 = std::operator&(memory_order_seq_cst,__memory_order_mask);
        if (local_74 - 1U < 2) {
          local_80 = *puVar17;
        }
        else if (local_74 == 5) {
          local_80 = *puVar17;
        }
        else {
          local_80 = *puVar17;
        }
        msg_if_given_abi_cxx11_
                  ((char *)local_1b8,"commit upto %lu, curruent idx %lu",uVar2,local_80);
        (*peVar16->_vptr_logger[8])
                  (peVar16,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"commit_in_bg_exec",0xb9,local_1b8);
        std::__cxx11::string::~string(local_1b8);
      }
    }
    peVar8 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d448d);
    iVar5 = (*peVar8->_vptr_log_store[3])();
    local_1c0 = CONCAT44(extraout_var,iVar5);
    if ((local_1c0 != 0) &&
       (_Var9 = std::__atomic_base::operator_cast_to_unsigned_long
                          ((__atomic_base<unsigned_long> *)in_stack_fffffffffffff9d8),
       _Var9 < local_1c0 - 1U)) {
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar3) {
        peVar16 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d451c);
        iVar5 = (*peVar16->_vptr_logger[7])();
        if (2 < iVar5) {
          peVar16 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d4555);
          puVar17 = (undefined8 *)(in_RDI + 0xa8);
          local_8c = 5;
          local_88 = puVar17;
          local_90 = std::operator&(memory_order_seq_cst,__memory_order_mask);
          if (local_8c - 1U < 2) {
            local_98 = *puVar17;
          }
          else if (local_8c == 5) {
            local_98 = *puVar17;
          }
          else {
            local_98 = *puVar17;
          }
          msg_if_given_abi_cxx11_
                    ((char *)local_1e0,
                     "current commit idx %lu is smaller than log start idx %lu - 1, adjust it to %lu"
                     ,local_98,local_1c0,local_1c0 + -1);
          (*peVar16->_vptr_logger[8])
                    (peVar16,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                     ,"commit_in_bg_exec",0xc2,local_1e0);
          std::__cxx11::string::~string(local_1e0);
        }
      }
      std::__atomic_base<unsigned_long>::operator=
                ((__atomic_base<unsigned_long> *)in_stack_fffffffffffff9e0,
                 (__int_type)in_stack_fffffffffffff9d8);
    }
    get_config((raft_server *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
    bVar3 = is_leader((raft_server *)CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8));
    local_3ea = 0;
    if (bVar3) {
      this_00 = std::
                __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1d4713);
      bVar3 = cluster_config::is_async_replication(this_00);
      local_3ea = bVar3 ^ 0xff;
    }
    local_1f1 = local_3ea & 1;
    local_1f2 = 1;
    local_1f3 = 1;
    timer_helper::timer_helper
              (in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8,
               SUB41(in_stack_fffffffffffff9d4 >> 0x18,0));
    while( true ) {
      _Var9 = std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base<unsigned_long> *)in_stack_fffffffffffff9d8);
      _Var10 = std::__atomic_base::operator_cast_to_unsigned_long
                         ((__atomic_base<unsigned_long> *)in_stack_fffffffffffff9d8);
      bVar3 = false;
      if (_Var9 < _Var10) {
        _Var9 = std::__atomic_base::operator_cast_to_unsigned_long
                          ((__atomic_base<unsigned_long> *)in_stack_fffffffffffff9d8);
        peVar8 = std::
                 __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1d47ef);
        iVar5 = (*peVar8->_vptr_log_store[2])();
        bVar3 = _Var9 < CONCAT44(extraout_var_00,iVar5) - 1U;
      }
      if (!bVar3) break;
      if ((((local_1f2 & 1) == 0) && (local_128 != 0)) &&
         (bVar3 = timer_helper::timeout
                            ((timer_helper *)
                             CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18)), bVar3))
      {
        bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar3) {
          peVar16 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d48aa);
          iVar5 = (*peVar16->_vptr_logger[7])();
          if (2 < iVar5) {
            peVar16 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1d48e3);
            uVar11 = timer_helper::get_ms(in_stack_fffffffffffffa10);
            msg_if_given_abi_cxx11_
                      ((char *)local_258,"abort commit due to timeout (%zu ms), %lu ms elapsed",
                       local_128,uVar11);
            (*peVar16->_vptr_logger[8])
                      (peVar16,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"commit_in_bg_exec",0xd2,local_258);
            std::__cxx11::string::~string(local_258);
          }
        }
        local_1f3 = 0;
        break;
      }
      local_1f2 = 0;
      bVar3 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffff9d8);
      if (bVar3) break;
      _Var9 = std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base<unsigned_long> *)in_stack_fffffffffffff9d8);
      local_260 = _Var9 + 1;
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar3) {
        peVar16 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d4a41);
        iVar5 = (*peVar16->_vptr_logger[7])();
        if (5 < iVar5) {
          peVar16 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d4a7a);
          puVar17 = (undefined8 *)(in_RDI + 0xa0);
          local_a4 = 5;
          local_a0 = puVar17;
          local_a8 = std::operator&(memory_order_seq_cst,__memory_order_mask);
          if (local_a4 - 1U < 2) {
            local_b0 = *puVar17;
          }
          else if (local_a4 == 5) {
            local_b0 = *puVar17;
          }
          else {
            local_b0 = *puVar17;
          }
          msg_if_given_abi_cxx11_
                    ((char *)local_280,"commit upto %lu, current idx %lu\n",local_b0,local_260);
          (*peVar16->_vptr_logger[8])
                    (peVar16,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                     ,"commit_in_bg_exec",0xdf,local_280);
          std::__cxx11::string::~string(local_280);
        }
      }
      peVar8 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1d4bd5);
      (*peVar8->_vptr_log_store[10])(local_290,peVar8,local_260);
      bVar3 = std::__shared_ptr::operator_cast_to_bool(local_290);
      if (!bVar3) {
        bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar3) {
          peVar16 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d4c39);
          iVar5 = (*peVar16->_vptr_logger[7])();
          if (0 < iVar5) {
            peVar16 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1d4c72);
            msg_if_given_abi_cxx11_
                      ((char *)local_2b0,"failed to get log entry with idx %lu",local_260);
            (*peVar16->_vptr_logger[8])
                      (peVar16,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"commit_in_bg_exec",0xe5,local_2b0);
            std::__cxx11::string::~string(local_2b0);
          }
        }
        std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                  ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1d4d30);
        peVar12 = std::
                  __shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1d4d38);
        (*peVar12->_vptr_state_mgr[8])(peVar12,0xffffffed);
        exit(-1);
      }
      peVar13 = std::
                __shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d4d62);
      uVar14 = log_entry::get_term(peVar13);
      if (uVar14 == 0) {
        bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar3) {
          peVar16 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d4db7);
          iVar5 = (*peVar16->_vptr_logger[7])();
          if (0 < iVar5) {
            peVar16 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1d4df0);
            msg_if_given_abi_cxx11_
                      (&stack0xfffffffffffffd30,"empty log at idx %lu, must be log corruption",
                       local_260);
            (*peVar16->_vptr_logger[8])
                      (peVar16,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"commit_in_bg_exec",0xf0,&stack0xfffffffffffffd30);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffd30);
          }
        }
        std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                  ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1d4e95);
        peVar12 = std::
                  __shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1d4e9d);
        (*peVar12->_vptr_state_mgr[8])(peVar12,0xffffffed);
        exit(-1);
      }
      peVar13 = std::
                __shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d4ec7);
      lVar4 = log_entry::get_val_type(peVar13);
      if (lVar4 == app_log) {
        commit_app_log(in_stack_fffffffffffffc78,in_RDI,le_00,
                       SUB41((uint)in_stack_fffffffffffffc64 >> 0x18,0));
      }
      else {
        peVar13 = std::
                  __shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1d4f20);
        lVar4 = log_entry::get_val_type(peVar13);
        if (lVar4 == conf) {
          commit_conf((raft_server *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                      in_stack_fffffffffffffae8,
                      (ptr<log_entry> *)
                      CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
        }
      }
      uVar14 = local_260;
      _local_2d8 = local_260 - 1;
      puVar19 = (ulong *)(in_RDI + 0xa8);
      local_48 = local_260;
      local_4c = 5;
      local_40 = local_2d8;
      local_38 = puVar19;
      local_20 = std::__cmpexch_failure_order(in_stack_fffffffffffff9d4);
      local_18 = uVar14;
      local_1c = 5;
      local_28 = uVar14;
      switch(0x1d5152) {
      default:
        if (local_20 - memory_order_consume < 2) {
          LOCK();
          uVar15 = *puVar19;
          local_29 = _local_2d8 == uVar15;
          if (local_29) {
            *puVar19 = uVar14;
            uVar15 = _local_2d8;
          }
          UNLOCK();
          if (!local_29) {
            _local_2d8 = uVar15;
          }
        }
        else if (local_20 == memory_order_seq_cst) {
          LOCK();
          uVar15 = *puVar19;
          in_stack_fffffffffffffaf7 = _local_2d8 == uVar15;
          if ((bool)in_stack_fffffffffffffaf7) {
            *puVar19 = uVar14;
            uVar15 = _local_2d8;
          }
          UNLOCK();
          local_29 = (bool)in_stack_fffffffffffffaf7;
          if (!(bool)in_stack_fffffffffffffaf7) {
            _local_2d8 = uVar15;
          }
        }
        else {
          LOCK();
          uVar15 = *puVar19;
          local_29 = _local_2d8 == uVar15;
          if (local_29) {
            *puVar19 = uVar14;
            uVar15 = _local_2d8;
          }
          UNLOCK();
          if (!local_29) {
            _local_2d8 = uVar15;
          }
        }
        break;
      case 2:
        if (local_20 - memory_order_consume < 2) {
          LOCK();
          uVar15 = *puVar19;
          local_29 = _local_2d8 == uVar15;
          if (local_29) {
            *puVar19 = uVar14;
            uVar15 = _local_2d8;
          }
          UNLOCK();
          if (!local_29) {
            _local_2d8 = uVar15;
          }
        }
        else if (local_20 == memory_order_seq_cst) {
          LOCK();
          uVar15 = *puVar19;
          local_29 = _local_2d8 == uVar15;
          if (local_29) {
            *puVar19 = uVar14;
            uVar15 = _local_2d8;
          }
          UNLOCK();
          if (!local_29) {
            _local_2d8 = uVar15;
          }
        }
        else {
          LOCK();
          in_stack_fffffffffffffae8 = *puVar19;
          in_stack_fffffffffffffae7 = _local_2d8 == in_stack_fffffffffffffae8;
          if ((bool)in_stack_fffffffffffffae7) {
            *puVar19 = uVar14;
            in_stack_fffffffffffffae8 = _local_2d8;
          }
          UNLOCK();
          local_29 = (bool)in_stack_fffffffffffffae7;
          if (!(bool)in_stack_fffffffffffffae7) {
            _local_2d8 = in_stack_fffffffffffffae8;
          }
        }
        break;
      case 3:
        if (local_20 - memory_order_consume < 2) {
          LOCK();
          uVar15 = *puVar19;
          local_29 = _local_2d8 == uVar15;
          if (local_29) {
            *puVar19 = uVar14;
            uVar15 = _local_2d8;
          }
          UNLOCK();
          if (!local_29) {
            _local_2d8 = uVar15;
          }
        }
        else if (local_20 == memory_order_seq_cst) {
          LOCK();
          uVar15 = *puVar19;
          local_29 = _local_2d8 == uVar15;
          if (local_29) {
            *puVar19 = uVar14;
            uVar15 = _local_2d8;
          }
          UNLOCK();
          if (!local_29) {
            _local_2d8 = uVar15;
          }
        }
        else {
          LOCK();
          uVar15 = *puVar19;
          local_29 = _local_2d8 == uVar15;
          if (local_29) {
            *puVar19 = uVar14;
            uVar15 = _local_2d8;
          }
          UNLOCK();
          if (!local_29) {
            _local_2d8 = uVar15;
          }
        }
        break;
      case 4:
        if (local_20 - memory_order_consume < 2) {
          LOCK();
          uVar15 = *puVar19;
          local_29 = _local_2d8 == uVar15;
          if (local_29) {
            *puVar19 = uVar14;
            uVar15 = _local_2d8;
          }
          UNLOCK();
          if (!local_29) {
            _local_2d8 = uVar15;
          }
        }
        else if (local_20 == memory_order_seq_cst) {
          LOCK();
          uVar15 = *puVar19;
          local_29 = _local_2d8 == uVar15;
          if (local_29) {
            *puVar19 = uVar14;
            uVar15 = _local_2d8;
          }
          UNLOCK();
          if (!local_29) {
            _local_2d8 = uVar15;
          }
        }
        else {
          LOCK();
          uVar15 = *puVar19;
          local_29 = _local_2d8 == uVar15;
          if (local_29) {
            *puVar19 = uVar14;
            uVar15 = _local_2d8;
          }
          UNLOCK();
          if (!local_29) {
            _local_2d8 = uVar15;
          }
        }
      }
      local_10 = local_2d8;
      local_8 = puVar19;
      if (local_29 == false) {
        bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar3) {
          peVar16 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d583d);
          iVar5 = (*peVar16->_vptr_logger[7])();
          if (1 < iVar5) {
            peVar16 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1d5876);
            msg_if_given_abi_cxx11_
                      ((char *)local_318,
                       "sm_commit_index_ has been changed from %lu to %lu, this thread attempted %lu"
                       ,local_260 - 1,_local_2d8);
            (*peVar16->_vptr_logger[8])
                      (peVar16,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"commit_in_bg_exec",0x10b,local_318);
            std::__cxx11::string::~string(local_318);
          }
        }
      }
      else {
        std::__atomic_base::operator_cast_to_unsigned_long
                  ((__atomic_base<unsigned_long> *)in_stack_fffffffffffff9d8);
        uVar14 = _local_2d8;
        uVar1 = _local_2d8 >> 0x38;
        bVar3 = SUB81(uVar1,0);
        _local_2d8 = uVar14;
        snapshot_and_compact(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,bVar3);
        iVar22 = *(int32_t *)(in_RDI + 0x38);
        _Var7 = std::__atomic_base::operator_cast_to_int
                          ((__atomic_base<int> *)in_stack_fffffffffffff9d8);
        cb_func::Param::Param(&local_2f0,iVar22,_Var7,-1,(void *)0x0);
        local_2f8 = local_260;
        local_2f0.ctx = &local_2f8;
        std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                  ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1d57ec);
        cb_func::call(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d4,
                      (Param *)CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8));
      }
      std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x1d5921);
    }
    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar3) {
      peVar16 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d5969);
      iVar5 = (*peVar16->_vptr_logger[7])();
      if (4 < iVar5) {
        peVar16 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d59a2);
        puVar17 = (undefined8 *)(in_RDI + 0xa0);
        local_bc = 5;
        local_b8 = puVar17;
        local_c0 = std::operator&(memory_order_seq_cst,__memory_order_mask);
        if (local_bc - 1U < 2) {
          local_c8 = *puVar17;
        }
        else if (local_bc == 5) {
          local_c8 = *puVar17;
        }
        else {
          local_c8 = *puVar17;
        }
        uVar2 = local_c8;
        puVar17 = (undefined8 *)(in_RDI + 0xa8);
        local_d4 = 5;
        local_d0 = puVar17;
        local_d8 = std::operator&(memory_order_seq_cst,__memory_order_mask);
        if (local_d4 - 1U < 2) {
          local_e0 = *puVar17;
        }
        else if (local_d4 == 5) {
          local_e0 = *puVar17;
        }
        else {
          local_e0 = *puVar17;
        }
        msg_if_given_abi_cxx11_
                  ((char *)local_338,"DONE: commit upto %lu, curruent idx %lu",uVar2,local_e0);
        (*peVar16->_vptr_logger[8])
                  (peVar16,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"commit_in_bg_exec",0x10f,local_338);
        std::__cxx11::string::~string(local_338);
      }
    }
    sVar6 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x1d5b8e);
    if (sVar6 == follower) {
      puVar17 = (undefined8 *)(in_RDI + 0x98);
      local_ec = 5;
      local_e8 = puVar17;
      local_f0 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      if (local_ec - 1U < 2) {
        local_f8 = (undefined1 *)*puVar17;
      }
      else if (local_ec == 5) {
        local_f8 = (undefined1 *)*puVar17;
      }
      else {
        local_f8 = (undefined1 *)*puVar17;
      }
      local_340 = local_f8;
      puVar17 = (undefined8 *)(in_RDI + 0xa8);
      local_104 = 5;
      local_100 = puVar17;
      local_108 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      if (local_104 - 1U < 2) {
        local_110 = (cb_func *)*puVar17;
      }
      else if (local_104 == 5) {
        local_110 = (cb_func *)*puVar17;
      }
      else {
        local_110 = (cb_func *)*puVar17;
      }
      local_348 = local_110;
      std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1d5cfd);
      nuraft::context::get_params
                ((context *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      bVar3 = std::atomic<bool>::load
                        ((atomic<bool> *)in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d4);
      puVar21 = local_340;
      pcVar20 = local_348;
      if ((bVar3) &&
         (peVar18 = std::
                    __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1d5d58),
         (pcVar20->func).super__Function_base._M_functor._M_pod_data + peVar18->stale_log_gap_ <
         puVar21)) {
        uVar23 = 0;
        std::atomic<bool>::store
                  ((atomic<bool> *)in_stack_fffffffffffff9d8,
                   SUB41(in_stack_fffffffffffff9d4 >> 0x18,0),in_stack_fffffffffffff9d0);
        iVar22 = *(int32_t *)(in_RDI + 0x38);
        _Var7 = std::__atomic_base::operator_cast_to_int
                          ((__atomic_base<int> *)in_stack_fffffffffffff9d8);
        cb_func::Param::Param(&local_370,iVar22,_Var7,-1,(void *)(ulong)uVar23);
        std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                  ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1d5de1);
        cb_func::call(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d4,
                      (Param *)CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8));
      }
      else {
        bVar3 = std::atomic<bool>::load
                          ((atomic<bool> *)in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d4);
        if ((!bVar3) &&
           (pcVar20 = local_348, puVar21 = local_340,
           peVar18 = std::
                     __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1d5e6f),
           puVar21 < (pcVar20->func).super__Function_base._M_functor._M_pod_data +
                     peVar18->fresh_log_gap_)) {
          std::atomic<bool>::store
                    ((atomic<bool> *)pcVar20,SUB41(in_stack_fffffffffffff9d4 >> 0x18,0),
                     in_stack_fffffffffffff9d0);
          in_stack_fffffffffffff9d4 = *(memory_order *)(in_RDI + 0x38);
          _Var7 = std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)pcVar20);
          cb_func::Param::Param
                    ((Param *)&stack0xfffffffffffffc78,in_stack_fffffffffffff9d4,_Var7,-1,
                     (void *)0x0);
          std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                    ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1d5ef5)
          ;
          cb_func::call(pcVar20,in_stack_fffffffffffff9d4,
                        (Param *)CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8));
        }
      }
      std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x1d5f21)
      ;
    }
    local_111 = local_1f3 & 1;
    local_140 = 1;
    std::shared_ptr<nuraft::cluster_config>::~shared_ptr
              ((shared_ptr<nuraft::cluster_config> *)0x1d5f49);
    commit_in_bg_exec::ExecCommitAutoCleaner::~ExecCommitAutoCleaner
              ((ExecCommitAutoCleaner *)
               CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
  }
  else {
    local_111 = 1;
    local_140 = 1;
  }
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
  return (bool)(local_111 & 1);
}

Assistant:

bool raft_server::commit_in_bg_exec(size_t timeout_ms) {
    std::unique_lock<std::mutex> ll(commit_lock_, std::try_to_lock);
    if (!ll.owns_lock()) {
        // Other thread is already doing commit.
        // This is caused by global workers only, as there is only one
        // thread running `commit_in_bg`. Raft server can request a new commit
        // while other worker is doing commit for that Raft server, and the
        // new request will be accepted since the global queue doesn't contain
        // the request for that Raft server (as it is popped by the worker).
        // In such a case, we can just ignore it.
        return true;
    }

    sm_commit_exec_in_progress_ = true;
    // Clear the flag automatically once we exit this function.
    struct ExecCommitAutoCleaner {
        ExecCommitAutoCleaner(std::function<void()> func) : clean_func_(func) {}
        ~ExecCommitAutoCleaner() { clean_func_(); }
        std::function<void()> clean_func_;
    } exec_auto_cleaner([this](){
        sm_commit_exec_in_progress_ = false;
        ea_sm_commit_exec_in_progress_->invoke();
    });

    p_db( "commit upto %" PRIu64 ", curruent idx %" PRIu64,
          quick_commit_index_.load(), sm_commit_index_.load() );

    ulong log_start_idx = log_store_->start_index();
    if ( log_start_idx &&
         sm_commit_index_ < log_start_idx - 1 ) {
        p_wn("current commit idx %" PRIu64 " is smaller than log start idx %" PRIu64 " - 1, "
             "adjust it to %" PRIu64 "",
             sm_commit_index_.load(),
             log_start_idx,
             log_start_idx - 1);
        sm_commit_index_ = log_start_idx - 1;
    }

    ptr<cluster_config> cur_config = get_config();
    bool need_to_handle_commit_elem = ( is_leader() &&
                                        !cur_config->is_async_replication() );

    bool first_loop_exec = true;
    bool finished_in_time = true;
    timer_helper tt(timeout_ms * 1000);
    while ( sm_commit_index_ < quick_commit_index_ &&
            sm_commit_index_ < log_store_->next_slot() - 1 ) {
        // NOTE: Skip timeout checking for the first loop execution.
        if (!first_loop_exec && timeout_ms && tt.timeout()) {
            p_wn( "abort commit due to timeout (%zu ms), %" PRIu64 " ms elapsed",
                  timeout_ms, tt.get_ms() );
            finished_in_time = false;
            break;
        }
        first_loop_exec = false;

        // Break the loop if state machine commit is paused.
        if (sm_commit_paused_) {
            break;
        }

        ulong index_to_commit = sm_commit_index_ + 1;
        p_tr( "commit upto %" PRIu64 ", current idx %" PRIu64 "\n",
              quick_commit_index_.load(), index_to_commit );

        ptr<log_entry> le = log_store_->entry_at(index_to_commit);
        if (!le)
        {
            // LCOV_EXCL_START
            p_ft( "failed to get log entry with idx %" PRIu64 "", index_to_commit );
            ctx_->state_mgr_->system_exit(raft_err::N19_bad_log_idx_for_term);
            ::exit(-1);
            // LCOV_EXCL_STOP
        }

        if (le->get_term() == 0) {
            // LCOV_EXCL_START
            // Zero term means that log store is corrupted
            // (failed to read log).
            p_ft( "empty log at idx %" PRIu64 ", must be log corruption",
                  index_to_commit );
            ctx_->state_mgr_->system_exit(raft_err::N19_bad_log_idx_for_term);
            ::exit(-1);
            // LCOV_EXCL_STOP
        }

        if (le->get_val_type() == log_val_type::app_log) {
            commit_app_log(index_to_commit, le, need_to_handle_commit_elem);

        } else if (le->get_val_type() == log_val_type::conf) {
            commit_conf(index_to_commit, le);
        }

        ulong exp_idx = index_to_commit - 1;
        if (sm_commit_index_.compare_exchange_strong(exp_idx, index_to_commit)) {
            snapshot_and_compact(sm_commit_index_);

            cb_func::Param param(id_, leader_);
            // Copy to other local variable to be safe.
            uint64_t log_idx = index_to_commit;
            param.ctx = &log_idx;
            ctx_->cb_func_.call(cb_func::StateMachineExecution, &param);
        } else {
            p_er("sm_commit_index_ has been changed from %" PRIu64 " to %" PRIu64 ", "
                 "this thread attempted %" PRIu64,
                 index_to_commit - 1,
                 exp_idx,
                 index_to_commit);
        }
    }
    p_db( "DONE: commit upto %" PRIu64 ", curruent idx %" PRIu64,
          quick_commit_index_.load(), sm_commit_index_.load() );
    if (role_ == srv_role::follower) {
        ulong leader_idx = leader_commit_index_.load();
        ulong local_idx = sm_commit_index_.load();
        ptr<raft_params> params = ctx_->get_params();

        if (data_fresh_.load() &&
            leader_idx > local_idx + params->stale_log_gap_) {
            data_fresh_.store(false);
            cb_func::Param param(id_, leader_);
            (void) ctx_->cb_func_.call(cb_func::BecomeStale, &param);

        } else if (!data_fresh_.load() &&
                   leader_idx < local_idx + params->fresh_log_gap_) {
            data_fresh_.store(true);
            cb_func::Param param(id_, leader_);
            (void) ctx_->cb_func_.call(cb_func::BecomeFresh, &param);
        }
    }
    return finished_in_time;
}